

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O3

Document * __thiscall svg::Document::operator<<(Document *this,Shape *shape)

{
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  (*(shape->super_Serializeable)._vptr_Serializeable[2])(local_30,shape,&this->layout);
  std::__cxx11::string::_M_append((char *)&this->body_nodes_str,(ulong)local_30[0]);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return this;
}

Assistant:

Document & operator<<(Shape const & shape)
        {
            body_nodes_str += shape.toString(layout);
            return *this;
        }